

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_vfs_close(ma_vfs *pVFS,ma_vfs_file file)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if (file != (ma_vfs_file)0x0 && pVFS != (ma_vfs *)0x0) {
    if (*(code **)((long)pVFS + 0x10) != (code *)0x0) {
      mVar1 = (**(code **)((long)pVFS + 0x10))();
      return mVar1;
    }
    mVar1 = MA_NOT_IMPLEMENTED;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_close(ma_vfs* pVFS, ma_vfs_file file)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pVFS == NULL || file == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onClose == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onClose(pVFS, file);
}